

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.cc
# Opt level: O3

void core::image::float_image_normalize(Ptr *image)

{
  float fVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  float *pfVar3;
  float *pfVar4;
  invalid_argument *this_00;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  peVar2 = (image->super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Null image given");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  this = (image->super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this->_M_use_count = this->_M_use_count + 1;
    }
  }
  pfVar3 = (peVar2->super_TypedImageBase<float>).data.
           super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start;
  lVar5 = (long)*(pointer *)
                 ((long)&(peVar2->super_TypedImageBase<float>).data.
                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data + 8) - (long)pfVar3;
  if (lVar5 == 0) {
    pfVar3 = (float *)0x0;
  }
  pfVar4 = (float *)((long)pfVar3 + lVar5);
  if (lVar5 == 0) {
    pfVar4 = (float *)0x0;
  }
  if (pfVar3 == pfVar4) {
    fVar9 = 3.4028235e+38;
    fVar6 = -3.4028235e+38;
  }
  else {
    fVar6 = -3.4028235e+38;
    fVar8 = -3.4028235e+38;
    fVar7 = 3.4028235e+38;
    do {
      fVar1 = *pfVar3;
      fVar9 = fVar1;
      if (fVar7 <= fVar1) {
        fVar9 = fVar7;
      }
      fVar7 = (float)(~-(uint)(fVar1 < fVar7) & (uint)fVar8 | -(uint)(fVar1 < fVar7) & (uint)fVar6);
      fVar6 = (float)(~-(uint)(fVar7 < fVar1) & (uint)fVar6 | -(uint)(fVar7 < fVar1) & (uint)fVar1);
      fVar8 = fVar1;
      if (fVar1 <= fVar7) {
        fVar8 = fVar7;
      }
      pfVar3 = pfVar3 + 1;
      fVar7 = fVar9;
    } while (pfVar3 != pfVar4);
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  peVar2 = (image->super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pfVar3 = (peVar2->super_TypedImageBase<float>).data.
           super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pfVar4 = *(pointer *)
            ((long)&(peVar2->super_TypedImageBase<float>).data.
                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data + 8);
  if (fVar6 <= fVar9) {
    if (pfVar3 != pfVar4) {
      memset(pfVar3,0,((long)pfVar4 + (-4 - (long)pfVar3) & 0xfffffffffffffffcU) + 4);
      return;
    }
  }
  else {
    lVar5 = (long)pfVar4 - (long)pfVar3;
    if (lVar5 == 0) {
      pfVar3 = (float *)0x0;
    }
    pfVar4 = (float *)((long)pfVar3 + lVar5);
    if (lVar5 == 0) {
      pfVar4 = (float *)0x0;
    }
    if (pfVar3 != pfVar4) {
      do {
        *pfVar3 = (*pfVar3 - fVar9) / (fVar6 - fVar9);
        pfVar3 = pfVar3 + 1;
      } while (pfVar3 != pfVar4);
    }
  }
  return;
}

Assistant:

void
float_image_normalize (FloatImage::Ptr image)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    float vmin, vmax;
    find_min_max_value<float>(image, &vmin, &vmax);
    if (vmin >= vmax)
    {
        image->fill(0.0f);
        return;
    }
    for (float* ptr = image->begin(); ptr != image->end(); ++ptr)
        *ptr = (*ptr - vmin) / (vmax - vmin);
}